

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  ImGuiStoragePair *it_00;
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiStoragePair local_38;
  ImGuiStoragePair *local_28;
  ImGuiStoragePair *it;
  void *val_local;
  ImGuiStorage *pIStack_10;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it = (ImGuiStoragePair *)val;
  val_local._4_4_ = key;
  pIStack_10 = this;
  pIVar1 = LowerBound(&this->Data,key);
  local_28 = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(&this->Data);
  it_00 = local_28;
  if ((pIVar1 == pIVar2) || (local_28->key != val_local._4_4_)) {
    ImGuiStoragePair::ImGuiStoragePair(&local_38,val_local._4_4_,it);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it_00,&local_38);
  }
  else {
    (local_28->field_1).val_p = it;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_p = val;
}